

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O3

void av1_set_mb_ur_variance(AV1_COMP *cpi)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  int *piVar4;
  bool bVar5;
  uint8_t *puVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  void *memblk;
  void *memblk_00;
  ulong uVar14;
  ulong uVar15;
  void **ppvVar16;
  int iVar17;
  buf_2d *extraout_RDX;
  buf_2d *extraout_RDX_00;
  buf_2d *extraout_RDX_01;
  buf_2d *pbVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  buf_2d buf;
  int local_14c;
  ulong local_130;
  undefined1 local_fc [36];
  ulong local_d8;
  ulong local_d0;
  void *local_c8 [2];
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  uint8_t *local_88;
  ulong local_80;
  MACROBLOCKD *local_78;
  void *local_70;
  buf_2d local_68;
  undefined1 local_48 [16];
  
  local_88 = (cpi->source->field_5).field_0.y_buffer;
  local_d0 = (ulong)(uint)(cpi->source->field_4).field_0.y_stride;
  BVar1 = ((cpi->common).seq_params)->sb_size;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
  uVar19 = (ulong)bVar2;
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
  local_fc._28_8_ = ZEXT18(bVar3);
  uVar20 = (int)((cpi->common).mi_params.mi_cols + (uint)bVar2 + -1) / (int)(uint)bVar2;
  uVar7 = (int)((uint)bVar3 + (cpi->common).mi_params.mi_rows + -1) / (int)(uint)bVar3;
  iVar8 = uVar7 * uVar20;
  memblk = aom_calloc((long)iVar8,4);
  local_c8[0] = memblk;
  if (memblk == (void *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate mb_delta_q[0]");
  }
  memblk_00 = aom_calloc((long)iVar8,4);
  local_70 = memblk_00;
  pbVar18 = extraout_RDX;
  if (memblk_00 == (void *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate mb_delta_q[1]");
    pbVar18 = extraout_RDX_00;
  }
  uVar14 = (ulong)uVar20;
  local_d8 = (ulong)uVar7;
  auVar28 = (undefined1  [16])0x0;
  uVar13 = uVar7;
  if (0 < (int)uVar7) {
    local_78 = &(cpi->td).mb.e_mbd;
    iVar22 = (int)local_d0;
    local_a8 = uVar19;
    local_b8 = local_fc._28_8_ & 0xffffffff;
    uVar15 = 0;
    uVar13 = 0;
    local_a0 = uVar19;
    auVar29 = auVar28;
    do {
      if ((int)uVar20 < 1) {
        uVar15 = uVar15 + 1;
      }
      else {
        local_98 = (ulong)(int)uVar13;
        local_90 = uVar15 * uVar14;
        iVar17 = (int)uVar15;
        iVar9 = (int)local_b8;
        local_b0 = uVar15 + 1;
        local_80 = local_b0 * local_b8;
        iVar12 = 0;
        local_130 = 0;
        local_14c = 0;
        do {
          iVar26 = (cpi->common).mi_params.mi_rows;
          dVar27 = NAN;
          local_48 = auVar29;
          if (iVar17 * iVar9 < iVar26) {
            iVar10 = (int)local_a8;
            uVar24 = (local_130 + 1) * local_a8;
            uVar15 = (ulong)(uint)(cpi->common).mi_params.mi_cols;
            dVar27 = 0.0;
            dVar30 = 0.0;
            uVar19 = local_98;
            do {
              puVar6 = local_88;
              if ((int)local_130 * iVar10 < (int)uVar15) {
                uVar23 = (long)local_14c;
                iVar26 = iVar12;
                do {
                  uVar23 = uVar23 + 2;
                  local_68.buf = puVar6 + (long)iVar26 + (long)(iVar22 * 4 * (int)uVar19);
                  local_68.stride = (int)local_d0;
                  local_fc._4_8_ = dVar27;
                  uVar11 = av1_get_perpixel_variance_facade(cpi,local_78,&local_68,BLOCK_8X8,0);
                  dVar27 = log((double)(uVar11 + (uVar11 == 0)));
                  dVar27 = dVar27 + (double)local_fc._4_8_;
                  dVar30 = dVar30 + 1.0;
                  uVar15 = (ulong)(cpi->common).mi_params.mi_cols;
                  if ((long)uVar15 <= (long)uVar23) break;
                  iVar26 = iVar26 + 8;
                } while ((uVar23 & 0xffffffff) < uVar24);
                iVar26 = (cpi->common).mi_params.mi_rows;
              }
              uVar19 = uVar19 + 2;
            } while (((long)uVar19 < (long)iVar26) && ((uVar19 & 0xffffffff) < local_80));
            dVar27 = dVar27 / dVar30;
            uVar19 = local_a0;
          }
          lVar21 = local_130 + local_90;
          dVar27 = exp(dVar27);
          dVar30 = exp(dVar27 * -0.004898);
          local_fc._4_8_ = dVar30 * -98.0 + 131.728;
          dVar30 = exp(dVar27 * -0.004898);
          *(int *)((long)memblk + lVar21 * 4) =
               (int)((double)(~-(ulong)((double)local_fc._4_8_ < 0.0) & 0x3fe0000000000000 |
                             -(ulong)((double)local_fc._4_8_ < 0.0) & 0xbfe0000000000000) +
                    dVar30 * -98.0 + 131.728);
          dVar30 = exp(dVar27 * -0.003093);
          uVar15 = -(ulong)(dVar30 * -68.8 + 180.4 < 0.0);
          local_fc._4_8_ = ~uVar15 & 0x3fe0000000000000 | uVar15 & 0xbfe0000000000000;
          local_fc._12_8_ = 0;
          dVar27 = exp(dVar27 * -0.003093);
          iVar26 = (int)(dVar27 * -68.8 + 180.4 + (double)local_fc._4_8_);
          *(int *)((long)memblk_00 + lVar21 * 4) = iVar26;
          auVar29._0_4_ = local_48._0_4_ + iVar26;
          auVar29._4_4_ = local_48._4_4_ + *(int *)((long)memblk + lVar21 * 4);
          auVar29._8_4_ = local_48._8_4_;
          auVar29._12_4_ = local_48._12_4_;
          local_130 = local_130 + 1;
          local_14c = local_14c + (int)uVar19;
          iVar12 = iVar12 + (uint)bVar2 * 4;
          uVar15 = local_b0;
          pbVar18 = extraout_RDX_01;
        } while (local_130 != uVar14);
      }
      uVar13 = uVar13 + local_fc._28_4_;
    } while (uVar15 != local_d8);
    auVar28._0_8_ = (double)auVar29._0_4_;
    auVar28._8_8_ = (double)auVar29._4_4_;
  }
  auVar31._0_8_ = (double)iVar8;
  auVar31._8_8_ = auVar31._0_8_;
  auVar28 = divpd(auVar28,auVar31);
  auVar32._8_8_ = -(ulong)(auVar28._8_8_ < 0.0);
  auVar32._0_8_ = -(ulong)(auVar28._0_8_ < 0.0);
  uVar13 = movmskpd(uVar13,auVar32);
  dVar27 = -0.5;
  dVar30 = -0.5;
  if ((uVar13 & 2) == 0) {
    dVar30 = 0.5;
  }
  iVar8 = (int)(auVar28._8_8_ + dVar30);
  local_68.buf = (uint8_t *)CONCAT44(local_68.buf._4_4_,iVar8);
  if ((uVar13 & 1) == 0) {
    dVar27 = 0.5;
  }
  local_fc._0_4_ = (undefined4)(auVar28._0_8_ + dVar27);
  uVar13 = (cpi->oxcf).rc_cfg.cq_level;
  uVar11 = uVar13 - iVar8;
  ppvVar16 = (void **)(ulong)uVar11;
  if ((int)uVar13 < iVar8) {
    ppvVar16 = local_c8;
    pbVar18 = &local_68;
    bVar5 = false;
    uVar11 = uVar13;
    iVar22 = iVar8;
  }
  else if ((int)uVar13 < (int)local_fc._0_4_) {
    iVar22 = local_fc._0_4_ - iVar8;
    bVar5 = true;
  }
  else {
    uVar11 = 0xff - uVar13;
    iVar22 = 0xff - local_fc._0_4_;
    ppvVar16 = &local_70;
    pbVar18 = (buf_2d *)local_fc;
    bVar5 = false;
  }
  if (0 < (int)uVar7) {
    dVar27 = (double)(int)uVar11 / (double)iVar22;
    lVar21 = 0;
    uVar19 = 0;
    do {
      if (0 < (int)uVar20) {
        piVar4 = cpi->mb_delta_q;
        uVar15 = uVar14;
        lVar25 = lVar21;
        do {
          if (bVar5) {
            dVar33 = ((double)(*(int *)((long)memblk_00 + lVar25) - *(int *)((long)memblk + lVar25))
                      * dVar27 + (double)*(int *)((long)memblk + lVar25)) -
                     ((double)(local_fc._0_4_ - iVar8) * dVar27 + (double)iVar8);
            dVar30 = (double)(cpi->oxcf).q_cfg.deltaq_strength / 100.0;
          }
          else {
            dVar33 = ((double)(cpi->oxcf).q_cfg.deltaq_strength / 100.0) * dVar27;
            dVar30 = (double)(*(int *)((long)*ppvVar16 + lVar25) - *(int *)&pbVar18->buf);
          }
          *(int *)((long)piVar4 + lVar25) =
               (int)(dVar30 * dVar33 +
                    *(double *)(&DAT_004d76d0 + (ulong)(dVar30 * dVar33 < 0.0) * 8));
          lVar25 = lVar25 + 4;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      uVar19 = uVar19 + 1;
      lVar21 = lVar21 + uVar14 * 4;
    } while (uVar19 != local_d8);
  }
  aom_free(memblk);
  aom_free(memblk_00);
  return;
}

Assistant:

void av1_set_mb_ur_variance(AV1_COMP *cpi) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = cpi->common.seq_params->sb_size;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;

  int *mb_delta_q[2];
  CHECK_MEM_ERROR(cm, mb_delta_q[0],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[0])));
  CHECK_MEM_ERROR(cm, mb_delta_q[1],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[1])));

  // Approximates the model change between current version (Spet 2021) and the
  // baseline (July 2021).
  const double model_change[] = { 3.0, 3.0 };
  // The following parameters are fitted from user labeled data.
  const double a[] = { -24.50 * 4.0, -17.20 * 4.0 };
  const double b[] = { 0.004898, 0.003093 };
  const double c[] = { (29.932 + model_change[0]) * 4.0,
                       (42.100 + model_change[1]) * 4.0 };
  int delta_q_avg[2] = { 0, 0 };
  // Loop through each SB block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          unsigned int block_variance;
          block_variance = av1_get_perpixel_variance_facade(
              cpi, xd, &buf, BLOCK_8X8, AOM_PLANE_Y);

          block_variance = AOMMAX(block_variance, 1);
          var += log((double)block_variance);
          num_of_var += 1.0;
        }
      }
      var = exp(var / num_of_var);
      mb_delta_q[0][index] = RINT(a[0] * exp(-b[0] * var) + c[0]);
      mb_delta_q[1][index] = RINT(a[1] * exp(-b[1] * var) + c[1]);
      delta_q_avg[0] += mb_delta_q[0][index];
      delta_q_avg[1] += mb_delta_q[1][index];
    }
  }

  delta_q_avg[0] = RINT((double)delta_q_avg[0] / (num_rows * num_cols));
  delta_q_avg[1] = RINT((double)delta_q_avg[1] / (num_rows * num_cols));

  int model_idx;
  double scaling_factor;
  const int cq_level = cpi->oxcf.rc_cfg.cq_level;
  if (cq_level < delta_q_avg[0]) {
    model_idx = 0;
    scaling_factor = (double)cq_level / delta_q_avg[0];
  } else if (cq_level < delta_q_avg[1]) {
    model_idx = 2;
    scaling_factor =
        (double)(cq_level - delta_q_avg[0]) / (delta_q_avg[1] - delta_q_avg[0]);
  } else {
    model_idx = 1;
    scaling_factor = (double)(MAXQ - cq_level) / (MAXQ - delta_q_avg[1]);
  }

  const double new_delta_q_avg =
      delta_q_avg[0] + scaling_factor * (delta_q_avg[1] - delta_q_avg[0]);
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      if (model_idx == 2) {
        const double delta_q =
            mb_delta_q[0][index] +
            scaling_factor * (mb_delta_q[1][index] - mb_delta_q[0][index]);
        cpi->mb_delta_q[index] = RINT((double)cpi->oxcf.q_cfg.deltaq_strength /
                                      100.0 * (delta_q - new_delta_q_avg));
      } else {
        cpi->mb_delta_q[index] = RINT(
            (double)cpi->oxcf.q_cfg.deltaq_strength / 100.0 * scaling_factor *
            (mb_delta_q[model_idx][index] - delta_q_avg[model_idx]));
      }
    }
  }

  aom_free(mb_delta_q[0]);
  aom_free(mb_delta_q[1]);
}